

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::
Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::Action(Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
         *this,ActionInterface<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *impl)

{
  ActionAdapter local_28;
  ActionInterface<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_18;
  ActionInterface<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *impl_local;
  Action<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                *)this;
  std::shared_ptr<testing::ActionInterface<bool(std::__cxx11::string_const&)>>::
  shared_ptr<testing::ActionInterface<bool(std::__cxx11::string_const&)>,void>
            ((shared_ptr<testing::ActionInterface<bool(std::__cxx11::string_const&)>> *)&local_28,
             impl);
  std::function<bool(std::__cxx11::string_const&)>::
  function<testing::Action<bool(std::__cxx11::string_const&)>::ActionAdapter,void>
            ((function<bool(std::__cxx11::string_const&)> *)this,&local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}